

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  DebugInfo *__ptr_00;
  bool bVar1;
  Value *pVVar2;
  DebugInfo *this_00;
  cmake *this_01;
  pointer *__ptr;
  pointer __p;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  cmServerResponse response;
  Value value;
  Value debugValue;
  cmServerRequest request;
  Reader reader;
  DebugInfo *local_358;
  undefined1 local_350 [32];
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  Value local_2e8;
  string local_2c0;
  Value local_2a0;
  string local_278;
  string local_258;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  Value local_1f0;
  Value local_1c8;
  cmServerRequest local_1a0;
  Reader local_128;
  
  Json::Reader::Reader(&local_128);
  Json::Value::Value(&local_2a0,nullValue);
  bVar1 = Json::Reader::parse(&local_128,input,&local_2a0,true);
  if (bVar1) {
    local_358 = (DebugInfo *)0x0;
    pVVar2 = Json::Value::operator[](&local_2a0,"debug");
    Json::Value::Value(&local_1f0,pVVar2);
    bVar1 = Json::Value::isNull(&local_1f0);
    if (!bVar1) {
      this_00 = (DebugInfo *)operator_new(0x30);
      DebugInfo::DebugInfo(this_00);
      __ptr_00 = local_358;
      local_350._0_8_ = (DebugInfo *)0x0;
      bVar1 = local_358 != (DebugInfo *)0x0;
      local_358 = this_00;
      if (bVar1) {
        std::default_delete<cmServer::DebugInfo>::operator()
                  ((default_delete<cmServer::DebugInfo> *)&local_358,__ptr_00);
      }
      if ((DebugInfo *)local_350._0_8_ != (DebugInfo *)0x0) {
        std::default_delete<cmServer::DebugInfo>::operator()
                  ((default_delete<cmServer::DebugInfo> *)local_350,(DebugInfo *)local_350._0_8_);
      }
      pVVar2 = Json::Value::operator[](&local_1f0,"dumpToFile");
      Json::Value::asString_abi_cxx11_((string *)local_350,pVVar2);
      std::__cxx11::string::operator=((string *)&local_358->OutputFile,(string *)local_350);
      if ((DebugInfo *)local_350._0_8_ != (DebugInfo *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
      pVVar2 = Json::Value::operator[](&local_1f0,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      local_358->PrintStatistics = bVar1;
    }
    pVVar2 = Json::Value::operator[](&local_2a0,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_258,pVVar2);
    pVVar2 = Json::Value::operator[](&local_2a0,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_278,pVVar2);
    Json::Value::Value(&local_1c8,&local_2a0);
    cmServerRequest::cmServerRequest(&local_1a0,this,connection,&local_258,&local_278,&local_1c8);
    Json::Value::~Value(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0.Type._M_string_length == 0) {
      cmServerResponse::cmServerResponse((cmServerResponse *)local_350,&local_1a0);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,"No type given in request.","");
      cmServerResponse::SetError((cmServerResponse *)local_350,&local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      WriteResponse(this,connection,(cmServerResponse *)local_350,(DebugInfo *)0x0);
    }
    else {
      local_218._8_8_ = 0;
      pcStack_200 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:100:5)>
                    ::_M_invoke;
      local_208 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:100:5)>
                  ::_M_manager;
      local_218._M_unused._M_object = &local_1a0;
      cmSystemTools::SetMessageCallback((MessageCallback *)&local_218);
      if (local_208 != (code *)0x0) {
        (*local_208)(&local_218,&local_218,__destroy_functor);
      }
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion((cmServerResponse *)local_350,this,&local_1a0);
        WriteResponse(this,connection,(cmServerResponse *)local_350,local_358);
      }
      else {
        this_01 = cmServerProtocol::CMakeInstance(this->Protocol);
        local_238._8_8_ = 0;
        pcStack_220 = std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:106:7)>
                      ::_M_invoke;
        local_228 = std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServer.cxx:106:7)>
                    ::_M_manager;
        local_238._M_unused._M_object = &local_1a0;
        cmake::SetProgressCallback(this_01,(ProgressCallbackType *)&local_238);
        if (local_228 != (code *)0x0) {
          (*local_228)(&local_238,&local_238,__destroy_functor);
        }
        (*this->Protocol->_vptr_cmServerProtocol[4])(local_350,this->Protocol,&local_1a0);
        WriteResponse(this,connection,(cmServerResponse *)local_350,local_358);
      }
    }
    Json::Value::~Value(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_p != &local_2f8) {
      operator_delete(local_308._M_p,local_2f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._0_8_ + 1);
    }
    if ((DebugInfo *)local_350._0_8_ != (DebugInfo *)(local_350 + 0x10)) {
      operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
    }
    Json::Value::~Value(&local_1a0.Data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.Cookie._M_dataplus._M_p != &local_1a0.Cookie.field_2) {
      operator_delete(local_1a0.Cookie._M_dataplus._M_p,
                      local_1a0.Cookie.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.Type._M_dataplus._M_p != &local_1a0.Type.field_2) {
      operator_delete(local_1a0.Type._M_dataplus._M_p,
                      local_1a0.Type.field_2._M_allocated_capacity + 1);
    }
    Json::Value::~Value(&local_1f0);
    if (local_358 != (DebugInfo *)0x0) {
      std::default_delete<cmServer::DebugInfo>::operator()
                ((default_delete<cmServer::DebugInfo> *)&local_358,local_358);
    }
  }
  else {
    local_350._0_8_ = (DebugInfo *)(local_350 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_350,"Failed to parse JSON input.","");
    WriteParseError(this,connection,(string *)local_350);
    if ((DebugInfo *)local_350._0_8_ != (DebugInfo *)(local_350 + 0x10)) {
      operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
    }
  }
  Json::Value::~Value(&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.commentsBefore_._M_dataplus._M_p != &local_128.commentsBefore_.field_2) {
    operator_delete(local_128.commentsBefore_._M_dataplus._M_p,
                    local_128.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.document_._M_dataplus._M_p != &local_128.document_.field_2) {
    operator_delete(local_128.document_._M_dataplus._M_p,
                    local_128.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_128.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_128);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = cm::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type.empty()) {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(
    [&request](const std::string& msg, const char* title) {
      reportMessage(msg, title, request);
    });

  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      [&request](const std::string& msg, float prog) {
        reportProgress(msg, prog, request);
      });
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}